

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

double __thiscall
tetgenmesh::interiorangle(tetgenmesh *this,double *o,double *p1,double *p2,double *n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double len2;
  double len1;
  double ori;
  double lenlen;
  double costheta;
  double theta;
  double np [3];
  double local_68;
  double v2 [3];
  double local_48;
  double v1 [3];
  double *n_local;
  double *p2_local;
  double *p1_local;
  double *o_local;
  tetgenmesh *this_local;
  
  local_48 = *p1 - *o;
  v1[0] = p1[1] - o[1];
  v1[1] = p1[2] - o[2];
  local_68 = *p2 - *o;
  v2[0] = p2[1] - o[1];
  v2[1] = p2[2] - o[2];
  v1[2] = (double)n;
  dVar1 = dot(this,&local_48,&local_48);
  dVar1 = sqrt(dVar1);
  dVar2 = dot(this,&local_68,&local_68);
  dVar2 = sqrt(dVar2);
  dVar3 = dot(this,&local_48,&local_68);
  lenlen = dVar3 / (dVar1 * dVar2);
  if (lenlen <= 1.0) {
    if (lenlen < -1.0) {
      lenlen = -1.0;
    }
  }
  else {
    lenlen = 1.0;
  }
  costheta = acos(lenlen);
  if (v1[2] != 0.0) {
    theta = *o + *(double *)v1[2];
    np[0] = o[1] + *(double *)((long)v1[2] + 8);
    np[1] = o[2] + *(double *)((long)v1[2] + 0x10);
    dVar1 = orient3d(p1,o,&theta,p2);
    if (0.0 < dVar1) {
      costheta = PI + PI + -costheta;
    }
  }
  return costheta;
}

Assistant:

REAL tetgenmesh::interiorangle(REAL* o, REAL* p1, REAL* p2, REAL* n)
{
  REAL v1[3], v2[3], np[3];
  REAL theta, costheta, lenlen;
  REAL ori, len1, len2;

  // Get the interior angle (0 - PI) between o->p1, and o->p2.
  v1[0] = p1[0] - o[0];
  v1[1] = p1[1] - o[1];
  v1[2] = p1[2] - o[2];
  v2[0] = p2[0] - o[0];
  v2[1] = p2[1] - o[1];
  v2[2] = p2[2] - o[2];
  len1 = sqrt(dot(v1, v1));
  len2 = sqrt(dot(v2, v2));
  lenlen = len1 * len2;

  costheta = dot(v1, v2) / lenlen;
  if (costheta > 1.0) {
    costheta = 1.0; // Roundoff. 
  } else if (costheta < -1.0) {
    costheta = -1.0; // Roundoff. 
  }
  theta = acos(costheta);
  if (n != NULL) {
    // Get a point above the face (o, p1, p2);
    np[0] = o[0] + n[0];
    np[1] = o[1] + n[1];
    np[2] = o[2] + n[2];
    // Adjust theta (0 - 2 * PI).
    ori = orient3d(p1, o, np, p2);
    if (ori > 0.0) {
      theta = 2 * PI - theta;
    }
  }

  return theta;
}